

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O1

void __thiscall
llvm::SMDiagnostic::SMDiagnostic
          (SMDiagnostic *this,SourceMgr *sm,SMLoc L,StringRef FN,int Line,int Col,DiagKind Kind,
          StringRef Msg,StringRef LineStr,ArrayRef<std::pair<unsigned_int,_unsigned_int>_> Ranges,
          ArrayRef<llvm::SMFixIt> Hints)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  SmallVectorImpl<llvm::SMFixIt> *pSVar4;
  ulong uVar5;
  char *pcVar6;
  void *pvVar7;
  
  pcVar6 = FN.Data;
  this->SM = sm;
  (this->Loc).Ptr = L.Ptr;
  (this->Filename)._M_dataplus._M_p = (pointer)&(this->Filename).field_2;
  if (pcVar6 == (char *)0x0) {
    (this->Filename)._M_string_length = 0;
    (this->Filename).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->Filename,pcVar6,pcVar6 + FN.Length);
  }
  this->LineNo = Line;
  this->ColumnNo = Col;
  this->Kind = Kind;
  if (Msg.Data == (char *)0x0) {
    (this->Message)._M_dataplus._M_p = (pointer)&(this->Message).field_2;
    (this->Message)._M_string_length = 0;
    (this->Message).field_2._M_local_buf[0] = '\0';
  }
  else {
    (this->Message)._M_dataplus._M_p = (pointer)&(this->Message).field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->Message,Msg.Data,Msg.Data + Msg.Length);
  }
  if (LineStr.Data == (char *)0x0) {
    (this->LineContents)._M_dataplus._M_p = (pointer)&(this->LineContents).field_2;
    (this->LineContents)._M_string_length = 0;
    (this->LineContents).field_2._M_local_buf[0] = '\0';
  }
  else {
    (this->LineContents)._M_dataplus._M_p = (pointer)&(this->LineContents).field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->LineContents,LineStr.Data,LineStr.Data + LineStr.Length);
  }
  (this->Ranges).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Ranges).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Ranges).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_range_initialize<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&this->Ranges,Ranges.Data,Ranges.Data + Ranges.Length);
  (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
  super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX =
       &(this->FixIts).super_SmallVectorStorage<llvm::SMFixIt,_4U>;
  pSVar4 = &(this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>;
  (pSVar4->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size = 0;
  (pSVar4->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Capacity = 4;
  SmallVectorImpl<llvm::SMFixIt>::append<llvm::SMFixIt_const*,void>
            (&(this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>,Hints.Data,
             Hints.Data + Hints.Length);
  uVar1 = (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
          super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
          super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  uVar5 = (ulong)uVar1;
  if (uVar5 != 0) {
    pvVar2 = (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
             super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
             super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
    pvVar7 = (void *)(uVar5 * 0x30 + (long)pvVar2);
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::__introsort_loop<llvm::SMFixIt*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar2,pvVar7,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<llvm::SMFixIt*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar2,pvVar7);
    return;
  }
  return;
}

Assistant:

SMDiagnostic::SMDiagnostic(const SourceMgr &sm, SMLoc L, StringRef FN,
                           int Line, int Col, SourceMgr::DiagKind Kind,
                           StringRef Msg, StringRef LineStr,
                           ArrayRef<std::pair<unsigned,unsigned>> Ranges,
                           ArrayRef<SMFixIt> Hints)
  : SM(&sm), Loc(L), Filename(FN), LineNo(Line), ColumnNo(Col), Kind(Kind),
    Message(Msg), LineContents(LineStr), Ranges(Ranges.vec()),
    FixIts(Hints.begin(), Hints.end()) {
  llvm::sort(FixIts.begin(), FixIts.end());
}